

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

ResetPtr createInitialisedReset(void)

{
  string *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ResetPtr RVar2;
  allocator<char> local_51;
  string local_50 [32];
  VariablePtr tv1;
  VariablePtr v1;
  
  libcellml::Reset::create();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"vA",(allocator<char> *)&tv1);
  libcellml::Variable::create((string *)&v1);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"vTest",&local_51);
  libcellml::Variable::create((string *)&tv1);
  std::__cxx11::string::~string(local_50);
  libcellml::Reset::setOrder((int)*(undefined8 *)in_RDI);
  psVar1 = *(string **)in_RDI;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"reset value math",&local_51);
  libcellml::Reset::setResetValue(psVar1);
  std::__cxx11::string::~string(local_50);
  psVar1 = *(string **)in_RDI;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"rv_id",&local_51);
  libcellml::Reset::setResetValueId(psVar1);
  std::__cxx11::string::~string(local_50);
  psVar1 = *(string **)in_RDI;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"test value math",&local_51);
  libcellml::Reset::setTestValue(psVar1);
  std::__cxx11::string::~string(local_50);
  psVar1 = *(string **)in_RDI;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"tv_id",&local_51);
  libcellml::Reset::setTestValueId(psVar1);
  std::__cxx11::string::~string(local_50);
  libcellml::Reset::setTestVariable(*(shared_ptr **)in_RDI);
  libcellml::Reset::setVariable(*(shared_ptr **)in_RDI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tv1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  RVar2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ResetPtr)RVar2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ResetPtr createInitialisedReset()
{
    libcellml::ResetPtr r = libcellml::Reset::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create("vA");
    libcellml::VariablePtr tv1 = libcellml::Variable::create("vTest");

    r->setOrder(3);
    r->setResetValue("reset value math");
    r->setResetValueId("rv_id");
    r->setTestValue("test value math");
    r->setTestValueId("tv_id");
    r->setTestVariable(tv1);
    r->setVariable(v1);

    return r;
}